

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::checkKKT(KktCheck *this)

{
  int *in_RDI;
  ofstream myfile;
  ostream local_208 [24];
  KktCheck *in_stack_fffffffffffffe10;
  KktCheck *in_stack_fffffffffffffe20;
  KktCheck *in_stack_fffffffffffffe50;
  KktCheck *in_stack_fffffffffffffe60;
  KktCheck *in_stack_ffffffffffffff10;
  
  if (*in_RDI != 0) {
    *(undefined1 *)(in_RDI + 0x4a) = 0;
    makeARCopy(in_stack_fffffffffffffe50);
    chPrimalBounds(in_stack_fffffffffffffe10);
    chPrimalFeas(in_stack_fffffffffffffe60);
    chDualFeas(in_stack_ffffffffffffff10);
    chComplementarySlackness(in_stack_fffffffffffffe50);
    chStOfLagrangian(in_stack_fffffffffffffe20);
    if (in_RDI[0x58] == 2) {
      std::ofstream::ofstream(local_208);
      std::ofstream::open((char *)local_208,0x1cfc5b);
      if ((*(byte *)(in_RDI + 0x4a) & 1) == 0) {
        std::operator<<(local_208,"           KKT pass      ");
      }
      else {
        std::operator<<(local_208,"           KKT fail      ");
      }
      std::ofstream::close();
      std::ofstream::~ofstream(local_208);
    }
  }
  return;
}

Assistant:

void KktCheck::checkKKT() {
	if (numCol == 0)
		return;
	
	istrueGlb = false;
	

	makeARCopy();
	//printAR();printSol();
	chPrimalBounds() ;
	chPrimalFeas();
	chDualFeas();
	chComplementarySlackness();
	chStOfLagrangian();
	
	if (print == 2) {
		ofstream myfile;
  		myfile.open ("../experiments/out", ios::app ); 
		if (istrueGlb)	
			myfile << "           KKT fail      ";
		else
			myfile << "           KKT pass      ";
  		myfile.close();
	}
		
}